

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

void __thiscall deqp::egl::ResizeTest::resize(ResizeTest *this,IVec2 *size)

{
  NativeWindow *pNVar1;
  Platform *pPVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_1a0;
  Vector<int,_2> local_20;
  IVec2 *local_18;
  IVec2 *size_local;
  ResizeTest *this_local;
  
  local_18 = size;
  size_local = (IVec2 *)this;
  pNVar1 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
           operator->(&(this->m_nativeWindow).
                       super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                     );
  tcu::Vector<int,_2>::Vector(&local_20,size);
  (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_20);
  pPVar2 = tcu::TestContext::getPlatform
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  (*pPVar2->_vptr_Platform[2])();
  tcu::TestLog::operator<<(&local_1a0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [25])"Resized surface to size ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,size);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void ResizeTest::resize (IVec2 size)
{
	m_nativeWindow->setSurfaceSize(size);
	m_testCtx.getPlatform().processEvents();
	m_log << TestLog::Message
		  << "Resized surface to size " << size
		  << TestLog::EndMessage;
}